

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Serializer::CheckNeedSize(Serializer *this,uint32_t need_size)

{
  ulong uVar1;
  size_type sVar2;
  size_t cap;
  size_t size;
  size_t check_need_size;
  uint32_t need_size_local;
  Serializer *this_local;
  
  uVar1 = (ulong)need_size;
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
  if (sVar2 - this->offset_ < (ulong)need_size) {
    sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
    if (sVar2 - this->offset_ < uVar1 << 1) {
      sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_,
                 sVar2 + uVar1 * 10);
    }
    sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_,
               sVar2 + uVar1 * 2);
  }
  return;
}

Assistant:

void Serializer::CheckNeedSize(uint32_t need_size) {
  size_t check_need_size = need_size;
  size_t size = buffer_.size() - static_cast<size_t>(offset_);
  if (size < need_size) {
    size_t cap = buffer_.capacity() - static_cast<size_t>(offset_);
    if (cap < (check_need_size * 2)) {
      buffer_.reserve(buffer_.capacity() + (check_need_size * 10));
    }
    buffer_.resize(buffer_.size() + (check_need_size * 2));
  }
}